

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::clear(Functions *gl,Vec4 *color)

{
  GLenum err;
  
  (*gl->clearColor)(color->m_data[0],color->m_data[1],color->m_data[2],color->m_data[3]);
  (*gl->clear)(0x4000);
  err = (*gl->getError)();
  glu::checkError(err,"Color clear failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                  ,0xd8);
  return;
}

Assistant:

void clear (const glw::Functions& gl, const tcu::Vec4& color)
{
	gl.clearColor(color.x(), color.y(), color.z(), color.w());
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Color clear failed");
}